

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void sexp_insert_timed(sexp_conflict ctx,sexp_conflict thread,sexp_conflict timeout)

{
  undefined1 auVar1 [16];
  sexp_conflict *ppsVar2;
  sexp_conflict psVar3;
  int *in_RDX;
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  bool bVar4;
  double dVar5;
  double dVar6;
  sexp_conflict ls2;
  sexp_conflict ls1;
  double d;
  sexp_conflict local_30;
  sexp_conflict local_28;
  
  local_28 = (sexp_conflict)&DAT_0000023e;
  sexp_delete_list(in_RDI,0x2c,in_RSI);
  local_30 = (sexp_conflict)(((in_RDI->value).type.setters)->value).context.mark_stack[10].end;
  if ((((((ulong)in_RDX & 1) == 1) || ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0xc)))) ||
      ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0xb)))) ||
     ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0xd)))) {
    gettimeofday((timeval *)&(in_RSI->value).context.tval,(__timezone_ptr_t)0x0);
  }
  if (((ulong)in_RDX & 1) == 1) {
    auVar1._8_8_ = (long)in_RDX >> 0x3f;
    auVar1._0_8_ = (ulong)in_RDX & 0xfffffffffffffffe;
    (in_RSI->value).context.tval.tv_sec =
         SUB168(auVar1 / SEXT816(2),0) + (in_RSI->value).context.tval.tv_sec;
  }
  else if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 0xb)) {
    dVar6 = *(double *)(in_RDX + 2);
    dVar5 = trunc(dVar6);
    (in_RSI->value).context.tval.tv_sec =
         (long)((double)(in_RSI->value).context.tval.tv_sec + dVar5);
    dVar5 = trunc(dVar6);
    (in_RSI->value).context.tval.tv_usec =
         (long)((dVar6 - dVar5) * 1000000.0 + (double)(in_RSI->value).context.tval.tv_usec);
    if (1000000 < (in_RSI->value).context.tval.tv_usec) {
      (in_RSI->value).context.tval.tv_sec = (in_RSI->value).context.tval.tv_sec + 1;
      (in_RSI->value).context.tval.tv_usec = (in_RSI->value).context.tval.tv_usec + -1000000;
    }
  }
  else if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 0xd)) {
    dVar6 = (double)sexp_ratio_to_double(in_RDI,in_RDX);
    dVar5 = trunc(dVar6);
    (in_RSI->value).context.tval.tv_sec =
         (long)((double)(in_RSI->value).context.tval.tv_sec + dVar5);
    dVar5 = trunc(dVar6);
    (in_RSI->value).context.tval.tv_usec =
         (long)((dVar6 - dVar5) * 1000000.0 + (double)(in_RSI->value).context.tval.tv_usec);
    if (1000000 < (in_RSI->value).context.tval.tv_usec) {
      (in_RSI->value).context.tval.tv_sec = (in_RSI->value).context.tval.tv_sec + 1;
      (in_RSI->value).context.tval.tv_usec = (in_RSI->value).context.tval.tv_usec + -1000000;
    }
  }
  else if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 0x24)) {
    (in_RSI->value).context.tval.tv_sec = *(__time_t *)(in_RDX + 0x1826);
    (in_RSI->value).context.tval.tv_usec = *(__suseconds_t *)(in_RDX + 0x1828);
  }
  else {
    (in_RSI->value).context.tval.tv_sec = 0;
    (in_RSI->value).context.tval.tv_usec = 0;
  }
  if ((((((ulong)in_RDX & 1) == 1) || ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0xc)))) ||
      ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0xb)))) ||
     (((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0xd)) ||
      ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0x24)))))) {
    while( true ) {
      bVar4 = false;
      if ((((((ulong)local_30 & 3) == 0) && (bVar4 = false, local_30->tag == 6)) &&
          ((*(long *)((long)&((local_30->value).type.name)->value + 0x6090) != 0 ||
           (bVar4 = false, *(long *)((long)&((local_30->value).type.name)->value + 0x6098) != 0))))
         && ((bVar4 = true,
             (in_RSI->value).context.tval.tv_sec <=
             *(long *)((long)&((local_30->value).type.name)->value + 0x6090) &&
             (bVar4 = false,
             *(long *)((long)&((local_30->value).type.name)->value + 0x6090) ==
             (in_RSI->value).context.tval.tv_sec)))) {
        bVar4 = *(long *)((long)&((local_30->value).type.name)->value + 0x6098) <
                (in_RSI->value).context.tval.tv_usec;
      }
      if (!bVar4) break;
      local_28 = local_30;
      local_30 = *(sexp_conflict *)((long)&local_30->value + 8);
    }
  }
  else {
    while( true ) {
      bVar4 = false;
      if ((((ulong)local_30 & 3) == 0) && (bVar4 = false, local_30->tag == 6)) {
        bVar4 = *(long *)((long)&((local_30->value).type.name)->value + 0x6090) != 0;
      }
      if (!bVar4) break;
      local_28 = local_30;
      local_30 = *(sexp_conflict *)((long)&local_30->value + 8);
    }
  }
  if (local_28 == (sexp_conflict)&DAT_0000023e) {
    ppsVar2 = (sexp_conflict *)sexp_cons_op(in_RDI,0,2,in_RSI,local_30);
    (((in_RDI->value).type.setters)->value).context.mark_stack[10].end = ppsVar2;
  }
  else {
    psVar3 = (sexp_conflict)sexp_cons_op(in_RDI,0,2,in_RSI,local_30);
    *(sexp_conflict *)((long)&local_28->value + 8) = psVar3;
  }
  return;
}

Assistant:

static void sexp_insert_timed (sexp ctx, sexp thread, sexp timeout) {
#if SEXP_USE_FLONUMS
  double d;
#endif
  sexp ls1=SEXP_NULL, ls2;
  sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, thread);
  ls2 = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
  if (sexp_realp(timeout))
    gettimeofday(&sexp_context_timeval(thread), NULL);
  if (sexp_fixnump(timeout)) {
    sexp_context_timeval(thread).tv_sec += sexp_unbox_fixnum(timeout);
#if SEXP_USE_FLONUMS
  } else if (sexp_flonump(timeout)) {
    d = sexp_flonum_value(timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
#if SEXP_USE_RATIOS
  } else if (sexp_ratiop(timeout)) {
    d = sexp_ratio_to_double(ctx, timeout);
    sexp_context_timeval(thread).tv_sec += trunc(d);
    sexp_context_timeval(thread).tv_usec += (d-trunc(d))*1000000;
    if (sexp_context_timeval(thread).tv_usec > 1000000) {
      sexp_context_timeval(thread).tv_sec += 1;
      sexp_context_timeval(thread).tv_usec -= 1000000;
    }
#endif
  } else if (sexp_contextp(timeout)) {
    sexp_context_timeval(thread).tv_sec = sexp_context_timeval(timeout).tv_sec;
    sexp_context_timeval(thread).tv_usec = sexp_context_timeval(timeout).tv_usec;
  } else {
    sexp_context_timeval(thread).tv_sec = 0;
    sexp_context_timeval(thread).tv_usec = 0;
  }
  if (sexp_realp(timeout) || sexp_contextp(timeout))
    while (sexp_pairp(ls2)
           && sexp_context_before(sexp_car(ls2), sexp_context_timeval(thread)))
      ls1=ls2, ls2=sexp_cdr(ls2);
  else
    while (sexp_pairp(ls2) && sexp_context_timeval(sexp_car(ls2)).tv_sec)
      ls1=ls2, ls2=sexp_cdr(ls2);
  if (ls1 == SEXP_NULL)
    sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cons(ctx, thread, ls2);
  else
    sexp_cdr(ls1) = sexp_cons(ctx, thread, ls2);
}